

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O1

QIcon __thiscall
QFileIconProviderPrivate::getIcon(QFileIconProviderPrivate *this,StandardPixmap name)

{
  QIcon QVar1;
  char cVar2;
  QStyle *pQVar3;
  int in_EDX;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  long lVar5;
  QIcon *pQVar6;
  long in_FS_OFFSET;
  QIcon local_30;
  QIcon local_28;
  long local_20;
  
  lVar5 = CONCAT44(in_register_00000034,name);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0xd:
    pQVar6 = (QIcon *)(lVar5 + 0x88);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0xd;
LAB_002b856a:
      (**(code **)(lVar5 + 0x100))(&local_30,pQVar3,uVar4,0,0);
      QVar1.d = local_30.d;
      local_30.d = (QIconPrivate *)0x0;
      local_28.d = pQVar6->d;
      pQVar6->d = QVar1.d;
      QIcon::~QIcon(&local_28);
      QIcon::~QIcon(&local_30);
    }
    break;
  case 0xe:
    pQVar6 = (QIcon *)(lVar5 + 0x90);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0xe;
      goto LAB_002b856a;
    }
    break;
  case 0xf:
    pQVar6 = (QIcon *)(lVar5 + 0x80);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0xf;
      goto LAB_002b856a;
    }
    break;
  case 0x10:
    pQVar6 = (QIcon *)(lVar5 + 0x60);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x10;
      goto LAB_002b856a;
    }
    break;
  case 0x11:
    pQVar6 = (QIcon *)(lVar5 + 0x58);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x11;
      goto LAB_002b856a;
    }
    break;
  case 0x12:
    pQVar6 = (QIcon *)(lVar5 + 0x68);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x12;
      goto LAB_002b856a;
    }
    break;
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
switchD_002b82ff_caseD_13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QIcon::QIcon((QIcon *)this);
      return (QIcon)(QIconPrivate *)this;
    }
    goto LAB_002b85c6;
  case 0x14:
    pQVar6 = (QIcon *)(lVar5 + 0x78);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x14;
      goto LAB_002b856a;
    }
    break;
  case 0x17:
    pQVar6 = (QIcon *)(lVar5 + 0x50);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x17;
      goto LAB_002b856a;
    }
    break;
  case 0x19:
    pQVar6 = (QIcon *)(lVar5 + 0x38);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x19;
      goto LAB_002b856a;
    }
    break;
  case 0x1a:
    pQVar6 = (QIcon *)(lVar5 + 0x40);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x1a;
      goto LAB_002b856a;
    }
    break;
  case 0x26:
    pQVar6 = (QIcon *)(lVar5 + 0x48);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x26;
      goto LAB_002b856a;
    }
    break;
  default:
    if (in_EDX != 0x38) goto switchD_002b82ff_caseD_13;
    pQVar6 = (QIcon *)(lVar5 + 0xa0);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      pQVar3 = QApplication::style();
      lVar5 = *(long *)pQVar3;
      uVar4 = 0x38;
      goto LAB_002b856a;
    }
  }
  QIcon::QIcon((QIcon *)this,pQVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QIcon)(QIconPrivate *)this;
  }
LAB_002b85c6:
  __stack_chk_fail();
}

Assistant:

QIcon QFileIconProviderPrivate::getIcon(QStyle::StandardPixmap name) const
{
    switch (name) {
    case QStyle::SP_FileIcon:
        if (file.isNull())
            file = QApplication::style()->standardIcon(name);
        return file;
    case QStyle::SP_FileLinkIcon:
        if (fileLink.isNull())
            fileLink = QApplication::style()->standardIcon(name);
        return fileLink;
    case QStyle::SP_DirIcon:
        if (directory.isNull())
            directory = QApplication::style()->standardIcon(name);
        return directory;
    case QStyle::SP_DirLinkIcon:
        if (directoryLink.isNull())
            directoryLink = QApplication::style()->standardIcon(name);
        return directoryLink;
    case QStyle::SP_DriveHDIcon:
        if (harddisk.isNull())
            harddisk = QApplication::style()->standardIcon(name);
        return harddisk;
    case QStyle::SP_DriveFDIcon:
        if (floppy.isNull())
            floppy = QApplication::style()->standardIcon(name);
        return floppy;
    case QStyle::SP_DriveCDIcon:
        if (cdrom.isNull())
            cdrom = QApplication::style()->standardIcon(name);
        return cdrom;
    case QStyle::SP_DriveNetIcon:
        if (network.isNull())
            network = QApplication::style()->standardIcon(name);
        return network;
    case QStyle::SP_ComputerIcon:
        if (computer.isNull())
            computer = QApplication::style()->standardIcon(name);
        return computer;
    case QStyle::SP_DesktopIcon:
        if (desktop.isNull())
            desktop = QApplication::style()->standardIcon(name);
        return desktop;
    case QStyle::SP_TrashIcon:
        if (trashcan.isNull())
            trashcan = QApplication::style()->standardIcon(name);
        return trashcan;
    case QStyle::SP_DirHomeIcon:
        if (home.isNull())
            home = QApplication::style()->standardIcon(name);
        return home;
    default:
        return QIcon();
    }
    return QIcon();
}